

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,char *__file,
          __off_t __length)

{
  OutputDirective *pOVar1;
  OutputDirective *pOVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  pOVar1 = this->ptr;
  while (pOVar2 = this->pos, pOVar1 + (long)__file < pOVar2) {
    this->pos = pOVar2 + -1;
    kj::_::NullableValue<kj::Path>::~NullableValue(&pOVar2[-1].dir.ptr);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }